

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall
QPDF::pushInheritedAttributesToPageInternal
          (QPDF *this,QPDFObjectHandle *cur_pages,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
          *key_ancestors,bool allow_changes,bool warn_skipped_keys)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  bool bVar1;
  int iVar2;
  QPDFExc *this_00;
  element_type *peVar3;
  undefined4 extraout_var;
  pointer pMVar4;
  qpdf_offset_t offset;
  size_type sVar5;
  pointer pMVar6;
  reference pTVar7;
  reference key_01;
  const_reference value;
  reference __k;
  mapped_type *pmVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  bool local_38d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_2;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *key_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  *iter;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
  *__range3;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  reference local_270;
  T *kid;
  iterator __end1_1;
  iterator __begin1_1;
  string local_210 [32];
  QPDFObjectHandle local_1f0;
  QPDFArrayItems local_1e0;
  QPDFArrayItems *local_1d0;
  QPDFArrayItems *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  QPDFObjGen local_184;
  allocator<char> local_179;
  string local_178;
  byte local_153;
  byte local_152;
  allocator<char> local_151;
  string local_150;
  QPDFObjectHandle local_130;
  QPDFObjectHandle local_120;
  QPDFObjectHandle local_110;
  undefined1 local_100 [8];
  QPDFObjectHandle oh;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inheritable_keys;
  bool warn_skipped_keys_local;
  bool allow_changes_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
  *key_ancestors_local;
  QPDFObjectHandle *cur_pages_local;
  QPDF *this_local;
  
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = warn_skipped_keys;
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = allow_changes;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  QPDFObjectHandle::getKeys_abi_cxx11_(&local_90,cur_pages);
  local_60 = &local_90;
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_60);
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(local_60);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&key);
    if (!bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set(&local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_210,"/Kids",
                 (allocator<char> *)
                 ((long)&__begin1_1.ivalue.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey(&local_1f0,(string *)cur_pages);
      QPDFObjectHandle::aitems(&local_1e0.oh);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1f0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&__begin1_1.ivalue.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      local_1d0 = &local_1e0;
      QPDFObjectHandle::QPDFArrayItems::begin
                ((iterator *)
                 &__end1_1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_1d0);
      QPDFObjectHandle::QPDFArrayItems::end((iterator *)&kid,local_1d0);
      while (bVar1 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                               ((iterator *)
                                &__end1_1.ivalue.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,(iterator *)&kid), bVar1) {
        pTVar7 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                           ((iterator *)
                            &__end1_1.ivalue.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        local_270 = pTVar7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"/Pages",&local_291)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
        bVar1 = QPDFObjectHandle::isDictionaryOfType(pTVar7,&local_290,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator(&local_291);
        if (bVar1) {
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range3,local_270);
          pushInheritedAttributesToPageInternal
                    (this,(QPDFObjectHandle *)&__range3,key_ancestors,
                     (bool)(inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_
                           & 1),
                     (bool)(inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_
                           & 1));
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3);
        }
        else {
          __end3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                   ::begin(key_ancestors);
          iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                    ::end(key_ancestors);
          while (bVar1 = std::operator!=(&__end3,(_Self *)&iter), bVar1) {
            key_01 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                     ::operator*(&__end3);
            bVar1 = QPDFObjectHandle::hasKey(local_270,&key_01->first);
            if (bVar1) {
              QTC::TC("qpdf","QPDF opt page resource hides ancestor",0);
            }
            else {
              QTC::TC("qpdf","QPDF opt resource inherited",0);
              pTVar7 = local_270;
              value = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
                                (&key_01->second);
              QPDFObjectHandle::replaceKey(pTVar7,&key_01->first,value);
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            ::operator++(&__end3);
          }
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::operator++
                  ((iterator *)
                   &__end1_1.ivalue.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&kid);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
                ((iterator *)
                 &__end1_1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems(&local_1e0);
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      if (bVar1) {
        QTC::TC("qpdf","QPDF opt no inheritable keys",0);
      }
      else {
        QTC::TC("qpdf","QPDF opt inheritable keys",0);
        __end2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
        key_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&key_2), bVar1) {
          __k = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                   ::operator[](key_ancestors,__k);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_back(pmVar8);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                   ::operator[](key_ancestors,__k);
          bVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty(pmVar8);
          if (bVar1) {
            QTC::TC("qpdf","QPDF opt erase empty key ancestor",0);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
            ::erase(key_ancestors,__k);
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
      return;
    }
    local_b8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    bVar1 = std::operator==(local_b8,"/MediaBox");
    if ((((bVar1) || (bVar1 = std::operator==(local_b8,"/CropBox"), bVar1)) ||
        (bVar1 = std::operator==(local_b8,"/Resources"), bVar1)) ||
       (bVar1 = std::operator==(local_b8,"/Rotate"), bVar1)) {
      if ((inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
        this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
        pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar6->file);
        iVar2 = (*peVar3->_vptr_InputSource[3])();
        pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar4->file);
        offset = InputSource::getLastOffset(peVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,
                   "optimize detected an inheritable attribute when called in no-change mode",
                   &local_d9);
        QPDFExc::QPDFExc(this_00,qpdf_e_internal,(string *)CONCAT44(extraout_var,iVar2),
                         &pMVar6->last_object_description,offset,&local_d8);
        __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      pVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1,local_b8);
      oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar9.first._M_node;
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_100,(string *)cur_pages);
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_100);
      QTC::TC("qpdf","QPDF opt direct pages resource",(byte)~bVar1 & 1);
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_100);
      if (!bVar1) {
        bVar1 = QPDFObjectHandle::isScalar((QPDFObjectHandle *)local_100);
        key_00 = local_b8;
        if (bVar1) {
          QTC::TC("qpdf","QPDF opt inherited scalar",0);
        }
        else {
          QPDFObjectHandle::QPDFObjectHandle(&local_120,(QPDFObjectHandle *)local_100);
          makeIndirectObject((QPDF *)&local_110,(QPDFObjectHandle *)this);
          QPDFObjectHandle::replaceKey(cur_pages,key_00,&local_110);
          QPDFObjectHandle::~QPDFObjectHandle(&local_110);
          QPDFObjectHandle::~QPDFObjectHandle(&local_120);
          QPDFObjectHandle::getKey(&local_130,(string *)cur_pages);
          QPDFObjectHandle::operator=((QPDFObjectHandle *)local_100,&local_130);
          QPDFObjectHandle::~QPDFObjectHandle(&local_130);
        }
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
               ::operator[](key_ancestors,local_b8);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (pmVar8,(value_type *)local_100);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
               ::operator[](key_ancestors,local_b8);
      sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(pmVar8);
      if (1 < sVar5) {
        QTC::TC("qpdf","QPDF opt key ancestors depth > 1",0);
      }
      QPDFObjectHandle::removeKey(cur_pages,local_b8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
    }
    else {
      bVar1 = std::operator==(local_b8,"/Type");
      if (((!bVar1) && (bVar1 = std::operator==(local_b8,"/Parent"), !bVar1)) &&
         ((bVar1 = std::operator==(local_b8,"/Kids"), !bVar1 &&
          (bVar1 = std::operator==(local_b8,"/Count"), !bVar1)))) {
        local_152 = 0;
        local_153 = 0;
        local_38d = false;
        if ((inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
          std::allocator<char>::allocator();
          local_152 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"/Parent",&local_151);
          local_153 = 1;
          local_38d = QPDFObjectHandle::hasKey(cur_pages,&local_150);
        }
        if ((local_153 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_150);
        }
        if ((local_152 & 1) != 0) {
          std::allocator<char>::~allocator(&local_151);
        }
        if (local_38d != false) {
          QTC::TC("qpdf","QPDF unknown key not inherited",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"Pages object",&local_179);
          local_184 = QPDFObjectHandle::getObjGen(cur_pages);
          setLastObjectDescription(this,&local_178,local_184);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator(&local_179);
          pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range1_1,"Unknown key ",local_b8);
          std::operator+(&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range1_1,
                         " in /Pages object is being discarded as a result of flattening the /Pages tree"
                        );
          warn(this,qpdf_e_pages,&pMVar6->last_object_description,0,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&__range1_1);
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void
QPDF::pushInheritedAttributesToPageInternal(
    QPDFObjectHandle cur_pages,
    std::map<std::string, std::vector<QPDFObjectHandle>>& key_ancestors,
    bool allow_changes,
    bool warn_skipped_keys)
{
    // Make a list of inheritable keys. Only the keys /MediaBox, /CropBox, /Resources, and /Rotate
    // are inheritable attributes. Push this object onto the stack of pages nodes that have values
    // for this attribute.

    std::set<std::string> inheritable_keys;
    for (auto const& key: cur_pages.getKeys()) {
        if ((key == "/MediaBox") || (key == "/CropBox") || (key == "/Resources") ||
            (key == "/Rotate")) {
            if (!allow_changes) {
                throw QPDFExc(
                    qpdf_e_internal,
                    m->file->getName(),
                    m->last_object_description,
                    m->file->getLastOffset(),
                    "optimize detected an inheritable attribute when called in no-change mode");
            }

            // This is an inheritable resource
            inheritable_keys.insert(key);
            QPDFObjectHandle oh = cur_pages.getKey(key);
            QTC::TC("qpdf", "QPDF opt direct pages resource", oh.isIndirect() ? 0 : 1);
            if (!oh.isIndirect()) {
                if (!oh.isScalar()) {
                    // Replace shared direct object non-scalar resources with indirect objects to
                    // avoid copying large structures around.
                    cur_pages.replaceKey(key, makeIndirectObject(oh));
                    oh = cur_pages.getKey(key);
                } else {
                    // It's okay to copy scalars.
                    QTC::TC("qpdf", "QPDF opt inherited scalar");
                }
            }
            key_ancestors[key].push_back(oh);
            if (key_ancestors[key].size() > 1) {
                QTC::TC("qpdf", "QPDF opt key ancestors depth > 1");
            }
            // Remove this resource from this node.  It will be reattached at the page level.
            cur_pages.removeKey(key);
        } else if (!((key == "/Type") || (key == "/Parent") || (key == "/Kids") ||
                     (key == "/Count"))) {
            // Warn when flattening, but not if the key is at the top level (i.e. "/Parent" not
            // set), as we don't change these; but flattening removes intermediate /Pages nodes.
            if ((warn_skipped_keys) && (cur_pages.hasKey("/Parent"))) {
                QTC::TC("qpdf", "QPDF unknown key not inherited");
                setLastObjectDescription("Pages object", cur_pages.getObjGen());
                warn(
                    qpdf_e_pages,
                    m->last_object_description,
                    0,
                    ("Unknown key " + key +
                     " in /Pages object is being discarded as a result of flattening the /Pages "
                     "tree"));
            }
        }
    }

    // Process descendant nodes. This method does not perform loop detection because all code paths
    // that lead here follow a call to getAllPages, which already throws an exception in the event
    // of a loop in the pages tree.
    for (auto& kid: cur_pages.getKey("/Kids").aitems()) {
        if (kid.isDictionaryOfType("/Pages")) {
            pushInheritedAttributesToPageInternal(
                kid, key_ancestors, allow_changes, warn_skipped_keys);
        } else {
            // Add all available inheritable attributes not present in this object to this object.
            for (auto const& iter: key_ancestors) {
                std::string const& key = iter.first;
                if (!kid.hasKey(key)) {
                    QTC::TC("qpdf", "QPDF opt resource inherited");
                    kid.replaceKey(key, iter.second.back());
                } else {
                    QTC::TC("qpdf", "QPDF opt page resource hides ancestor");
                }
            }
        }
    }

    // For each inheritable key, pop the stack.  If the stack becomes empty, remove it from the map.
    // That way, the invariant that the list of keys in key_ancestors is exactly those keys for
    // which inheritable attributes are available.

    if (!inheritable_keys.empty()) {
        QTC::TC("qpdf", "QPDF opt inheritable keys");
        for (auto const& key: inheritable_keys) {
            key_ancestors[key].pop_back();
            if (key_ancestors[key].empty()) {
                QTC::TC("qpdf", "QPDF opt erase empty key ancestor");
                key_ancestors.erase(key);
            }
        }
    } else {
        QTC::TC("qpdf", "QPDF opt no inheritable keys");
    }
}